

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op2d.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
backtrack(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
         vector<unsigned_int,_std::allocator<unsigned_int>_> *cp_raw)

{
  size_type sVar1;
  reference pvVar2;
  iterator __first;
  iterator __last;
  value_type local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  uint x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cp_raw_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cp;
  
  pvStack_18 = cp_raw;
  cp_raw_local = __return_storage_ptr__;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(cp_raw);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](cp_raw,sVar1 - 1);
  local_1c = *pvVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  while (local_1c != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_1c);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (cp_raw,(ulong)local_1c);
    local_1c = *pvVar2;
  }
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(__return_storage_ptr__);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(__return_storage_ptr__);
  std::
  reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current);
  return __return_storage_ptr__;
}

Assistant:

vector<unsigned int> backtrack(vector<unsigned int> cp_raw) {
  /* @brief  backtrack the changepoint vector */
  unsigned int x = cp_raw[cp_raw.size() - 1];
  vector<unsigned int> cp;
  while (x > 0) {
    cp.push_back(x);
    x = cp_raw[x];
  }
  reverse(cp.begin(), cp.end());
  return cp;
}